

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_cell.c
# Opt level: O1

REF_STATUS
ref_cell_local_gem(REF_CELL ref_cell,REF_NODE ref_node,REF_INT node0,REF_INT node1,REF_BOOL *local)

{
  uint uVar1;
  int iVar2;
  REF_ADJ_ITEM pRVar3;
  ulong uVar4;
  long lVar5;
  REF_INT RVar6;
  ulong uVar7;
  ulong uVar8;
  
  *local = 0;
  uVar4 = 0xffffffff;
  if (-1 < node0) {
    uVar4 = 0xffffffff;
    if (node0 < ref_cell->ref_adj->nnode) {
      uVar4 = (ulong)(uint)ref_cell->ref_adj->first[(uint)node0];
    }
  }
  if ((int)uVar4 != -1) {
    RVar6 = ref_cell->ref_adj->item[(int)uVar4].ref;
    uVar1 = ref_cell->node_per;
    do {
      if (0 < (int)uVar1) {
        lVar5 = (long)RVar6 * (long)ref_cell->size_per;
        uVar7 = 0;
        do {
          if (ref_cell->c2n[(long)(int)lVar5 + uVar7] == node1) {
            uVar8 = 0;
            do {
              if (ref_node->ref_mpi->id != ref_node->part[ref_cell->c2n[lVar5 + uVar8]]) {
                return 0;
              }
              uVar8 = uVar8 + 1;
            } while (uVar1 != uVar8);
          }
          uVar7 = uVar7 + 1;
        } while (uVar7 != uVar1);
      }
      pRVar3 = ref_cell->ref_adj->item;
      iVar2 = pRVar3[(int)uVar4].next;
      uVar4 = (ulong)iVar2;
      if (uVar4 == 0xffffffffffffffff) {
        RVar6 = -1;
      }
      else {
        RVar6 = pRVar3[uVar4].ref;
      }
    } while (iVar2 != -1);
  }
  *local = 1;
  return 0;
}

Assistant:

REF_FCN REF_STATUS ref_cell_local_gem(REF_CELL ref_cell, REF_NODE ref_node,
                                      REF_INT node0, REF_INT node1,
                                      REF_BOOL *local) {
  REF_INT item, cell, search_node, test_node;

  *local = REF_FALSE;

  each_ref_cell_having_node(ref_cell, node0, item, cell) {
    for (search_node = 0; search_node < ref_cell_node_per(ref_cell);
         search_node++) {
      if (node1 == ref_cell_c2n(ref_cell, search_node, cell)) {
        for (test_node = 0; test_node < ref_cell_node_per(ref_cell);
             test_node++) {
          if (!ref_node_owned(ref_node,
                              ref_cell_c2n(ref_cell, test_node, cell))) {
            return REF_SUCCESS;
          }
        }
      }
    }
  }

  *local = REF_TRUE;

  return REF_SUCCESS;
}